

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

longlong __thiscall mkvparser::EBMLHeader::Parse(EBMLHeader *this,IMkvReader *pReader,longlong *pos)

{
  bool bVar1;
  int iVar2;
  longlong lVar3;
  longlong lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uchar scan_byte;
  long len;
  longlong available;
  longlong total;
  longlong size;
  longlong id;
  char local_61;
  long local_60;
  long local_58;
  char **local_50;
  long local_48;
  long local_40;
  long local_38;
  
  if (pReader != (IMkvReader *)0x0) {
    iVar2 = (*pReader->_vptr_IMkvReader[1])(pReader,&local_48,&local_58);
    if (iVar2 < 0) {
LAB_00154454:
      return (long)iVar2;
    }
    *pos = 0;
    lVar7 = 0x400;
    if (local_58 < 0x400) {
      lVar7 = local_58;
    }
    local_61 = '\0';
    if (0 < local_58) {
      lVar6 = 0;
      do {
        iVar2 = (**pReader->_vptr_IMkvReader)(pReader,lVar6,1,&local_61);
        if (iVar2 < 0) goto LAB_00154454;
        if (iVar2 != 0) {
          return -3;
        }
        if (local_61 == '\x1a') break;
        lVar6 = *pos + 1;
        *pos = lVar6;
      } while (lVar6 < lVar7);
    }
    local_60 = 0;
    lVar3 = ReadID(pReader,*pos,&local_60);
    if (lVar3 == -3) {
      return -3;
    }
    if ((lVar3 == 0x1a45dfa3) && (local_60 == 4)) {
      lVar7 = *pos;
      *pos = lVar7 + 4;
      lVar3 = GetUIntLength(pReader,lVar7 + 4,&local_60);
      if (-1 < lVar3) {
        if (lVar3 != 0) {
          return -3;
        }
        if ((0xfffffffffffffff7 < local_60 - 9U) &&
           ((local_48 < 0 || (local_60 <= local_48 - *pos)))) {
          lVar7 = *pos;
          if (local_58 - lVar7 < local_60) {
            return lVar7 + local_60;
          }
          lVar3 = ReadUInt(pReader,lVar7,&local_60);
          if (lVar3 < 0) {
            return lVar3;
          }
          lVar7 = *pos + local_60;
          *pos = lVar7;
          if (local_48 < 0 || lVar3 <= local_48 - lVar7) {
            lVar6 = lVar7 + lVar3;
            if (local_58 - lVar7 < lVar3) {
              return lVar6;
            }
            Init(this);
            local_50 = &this->m_docType;
            while (*pos < lVar6) {
              lVar4 = ParseElementHeader(pReader,pos,lVar6,&local_38,&local_40);
              lVar7 = local_40;
              if (lVar4 < 0) {
LAB_00154568:
                bVar1 = false;
                goto LAB_00154614;
              }
              if (local_40 == 0) goto LAB_0015460b;
              if (0x42f1 < local_38) {
                if (local_38 == 0x42f2) {
                  lVar5 = UnserializeUInt(pReader,*pos,local_40);
                  this->m_maxIdLength = lVar5;
                }
                else if (local_38 == 0x42f3) {
                  lVar5 = UnserializeUInt(pReader,*pos,local_40);
                  this->m_maxSizeLength = lVar5;
                }
                else {
                  if (local_38 != 0x42f7) goto switchD_0015453b_caseD_4283;
                  lVar5 = UnserializeUInt(pReader,*pos,local_40);
                  this->m_readVersion = lVar5;
                }
                goto LAB_001545ff;
              }
              switch(local_38) {
              case 0x4282:
                if (*local_50 != (char *)0x0) goto LAB_0015460b;
                lVar4 = UnserializeString(pReader,*pos,local_40,local_50);
                if (lVar4 != 0) goto LAB_00154568;
              default:
                goto switchD_0015453b_caseD_4283;
              case 0x4285:
                lVar5 = UnserializeUInt(pReader,*pos,local_40);
                this->m_docTypeReadVersion = lVar5;
                break;
              case 0x4286:
                lVar5 = UnserializeUInt(pReader,*pos,local_40);
                this->m_version = lVar5;
                break;
              case 0x4287:
                lVar5 = UnserializeUInt(pReader,*pos,local_40);
                this->m_docTypeVersion = lVar5;
              }
LAB_001545ff:
              if (lVar5 < 1) {
LAB_0015460b:
                bVar1 = false;
                lVar4 = -2;
              }
              else {
switchD_0015453b_caseD_4283:
                *pos = *pos + lVar7;
                bVar1 = true;
                lVar4 = lVar3;
              }
LAB_00154614:
              lVar3 = lVar4;
              if (!bVar1) {
                return lVar4;
              }
            }
            if ((((*pos == lVar6) && (this->m_docType != (char *)0x0)) &&
                (0 < this->m_docTypeReadVersion)) && (0 < this->m_docTypeVersion)) {
              if (this->m_maxIdLength - 5U < 0xfffffffffffffffc) {
                return -2;
              }
              return (ulong)(0xfffffffffffffff7 < this->m_maxSizeLength - 9U) * 2 + -2;
            }
          }
        }
      }
    }
  }
  return -2;
}

Assistant:

long long EBMLHeader::Parse(IMkvReader* pReader, long long& pos) {
  if (!pReader)
    return E_FILE_FORMAT_INVALID;

  long long total, available;

  long status = pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  pos = 0;

  // Scan until we find what looks like the first byte of the EBML header.
  const long long kMaxScanBytes = (available >= 1024) ? 1024 : available;
  const unsigned char kEbmlByte0 = 0x1A;
  unsigned char scan_byte = 0;

  while (pos < kMaxScanBytes) {
    status = pReader->Read(pos, 1, &scan_byte);

    if (status < 0)  // error
      return status;
    else if (status > 0)
      return E_BUFFER_NOT_FULL;

    if (scan_byte == kEbmlByte0)
      break;

    ++pos;
  }

  long len = 0;
  const long long ebml_id = ReadID(pReader, pos, len);

  if (ebml_id == E_BUFFER_NOT_FULL)
    return E_BUFFER_NOT_FULL;

  if (len != 4 || ebml_id != libwebm::kMkvEBML)
    return E_FILE_FORMAT_INVALID;

  // Move read pos forward to the EBML header size field.
  pos += 4;

  // Read length of size field.
  long long result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error
    return E_FILE_FORMAT_INVALID;
  else if (result > 0)  // need more data
    return E_BUFFER_NOT_FULL;

  if (len < 1 || len > 8)
    return E_FILE_FORMAT_INVALID;

  if ((total >= 0) && ((total - pos) < len))
    return E_FILE_FORMAT_INVALID;

  if ((available - pos) < len)
    return pos + len;  // try again later

  // Read the EBML header size.
  result = ReadUInt(pReader, pos, len);

  if (result < 0)  // error
    return result;

  pos += len;  // consume size field

  // pos now designates start of payload

  if ((total >= 0) && ((total - pos) < result))
    return E_FILE_FORMAT_INVALID;

  if ((available - pos) < result)
    return pos + result;

  const long long end = pos + result;

  Init();

  while (pos < end) {
    long long id, size;

    status = ParseElementHeader(pReader, pos, end, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvEBMLVersion) {
      m_version = UnserializeUInt(pReader, pos, size);

      if (m_version <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLReadVersion) {
      m_readVersion = UnserializeUInt(pReader, pos, size);

      if (m_readVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLMaxIDLength) {
      m_maxIdLength = UnserializeUInt(pReader, pos, size);

      if (m_maxIdLength <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLMaxSizeLength) {
      m_maxSizeLength = UnserializeUInt(pReader, pos, size);

      if (m_maxSizeLength <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDocType) {
      if (m_docType)
        return E_FILE_FORMAT_INVALID;

      status = UnserializeString(pReader, pos, size, m_docType);

      if (status)  // error
        return status;
    } else if (id == libwebm::kMkvDocTypeVersion) {
      m_docTypeVersion = UnserializeUInt(pReader, pos, size);

      if (m_docTypeVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDocTypeReadVersion) {
      m_docTypeReadVersion = UnserializeUInt(pReader, pos, size);

      if (m_docTypeReadVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;
  }

  if (pos != end)
    return E_FILE_FORMAT_INVALID;

  // Make sure DocType, DocTypeReadVersion, and DocTypeVersion are valid.
  if (m_docType == NULL || m_docTypeReadVersion <= 0 || m_docTypeVersion <= 0)
    return E_FILE_FORMAT_INVALID;

  // Make sure EBMLMaxIDLength and EBMLMaxSizeLength are valid.
  if (m_maxIdLength <= 0 || m_maxIdLength > 4 || m_maxSizeLength <= 0 ||
      m_maxSizeLength > 8)
    return E_FILE_FORMAT_INVALID;

  return 0;
}